

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.cpp
# Opt level: O0

void * IM483IThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  char local_828 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_620;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_5c8 [4];
  BOOL bConnected;
  CHRONO chrono_sail_calibration;
  double angle;
  IM483I im483i;
  void *pParam_local;
  
  chrono_sail_calibration.Suspended = 0;
  chrono_sail_calibration._68_4_ = 0;
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_620 = 0;
  im483i.MaxAngle = (double)pParam;
  memset(&angle,0,0x568);
  StartChrono((CHRONO *)local_5c8);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseIM483I == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("IM483I paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectIM483I((IM483I *)&angle);
      }
      if (bExit != 0) goto LAB_001d7e9e;
      mSleep(100);
    }
    if (bRestartIM483I != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a IM483I.\n");
        chrono_period._68_4_ = 0;
        DisconnectIM483I((IM483I *)&angle);
      }
      bRestartIM483I = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectIM483I((IM483I *)&angle,"IM483I0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = im483i.BaudRate;
        bSailCalibrated = 0;
        if (im483i.RS232Port._784_8_ != 0) {
          fclose((FILE *)im483i.RS232Port._784_8_);
          im483i.RS232Port.DevType = 0;
          im483i.RS232Port._788_4_ = 0;
        }
        if ((im483i.timeout != 0) && (im483i.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)((long)&im483i.pfSaveFile + 4));
          if (sVar2 == 0) {
            sprintf(local_828,"im483i");
          }
          else {
            sprintf(local_828,"%.127s",(undefined1 *)((long)&im483i.pfSaveFile + 4));
          }
          sVar2 = strlen(local_828);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_828[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_828), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_828);
            memset(local_828 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_828,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          im483i.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)im483i.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create IM483I data file.\n");
            goto LAB_001d7e9e;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else if (((robid == 0x2000) || (robid == 0x4000)) || (robid == 0x8000)) {
      dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_5c8);
      if (((sail_calibration_period < dVar4) || ((bCalibrateSail != 0 && (bSailCalibrated == 0))))
         || (bForceSailCalibration != 0)) {
        if (((bCalibrateSail != 0) && (bSailCalibrated == 0)) && (bCheckRudder != 0)) {
          mSleep(7000);
        }
        bSailCalibrated = 0;
        iVar1 = CalibrateMotorIM483I((IM483I *)&angle);
        if (iVar1 != 0) {
          printf("Connection to a IM483I lost.\n");
          bSailCalibrated = 0;
          chrono_period._68_4_ = 0;
          DisconnectIM483I((IM483I *)&angle);
          goto LAB_001d7e47;
        }
        bSailCalibrated = 1;
        bForceSailCalibration = 0;
        StopChronoQuick((CHRONO *)local_5c8);
        StartChrono((CHRONO *)local_5c8);
      }
      EnterCriticalSection(&StateVariablesCS);
      if (u_f <= 0.0) {
        chrono_sail_calibration.Suspended = im483i.NormalRunTorque;
        chrono_sail_calibration._68_4_ = im483i.ThresholdRval;
      }
      else {
        chrono_sail_calibration._64_8_ =
             u_f * (im483i.MinAngle - (double)im483i._1360_8_) + (double)im483i._1360_8_;
      }
      LeaveCriticalSection(&StateVariablesCS);
      szSaveFilePath[0xfc] = '\0';
      szSaveFilePath[0xfd] = '\0';
      szSaveFilePath[0xfe] = '\0';
      szSaveFilePath[0xff] = '\0';
      while (iVar1 = SetMaxAngleIM483I((IM483I *)&angle,(double)chrono_sail_calibration._64_8_),
            iVar1 != 0) {
        if (4 < (int)szSaveFilePath._252_4_) {
          printf("Connection to a IM483I lost.\n");
          bSailCalibrated = 0;
          chrono_period._68_4_ = 0;
          DisconnectIM483I((IM483I *)&angle);
          break;
        }
        mSleep((long)(int)im483i.szDevPath._252_4_);
        szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + 1;
      }
    }
LAB_001d7e47:
    if (((chrono_period._68_4_ == 0) && (local_620 = local_620 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_620)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001d7e9e:
      StopChronoQuick((CHRONO *)&errcount);
      StopChronoQuick((CHRONO *)local_5c8);
      if (im483i.RS232Port._784_8_ != 0) {
        fclose((FILE *)im483i.RS232Port._784_8_);
        im483i.RS232Port.DevType = 0;
        im483i.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectIM483I((IM483I *)&angle);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I im483i;
	double angle = 0;
	CHRONO chrono_sail_calibration;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&im483i, 0, sizeof(IM483I));

	StartChrono(&chrono_sail_calibration);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseIM483I) 
		{
			if (bConnected)
			{
				printf("IM483I paused.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartIM483I) 
		{
			if (bConnected)
			{
				printf("Restarting a IM483I.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			bRestartIM483I = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectIM483I(&im483i, "IM483I0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = im483i.threadperiod;

				//EnterCriticalSection(&StateVariablesCS);
				bSailCalibrated = FALSE;
				//LeaveCriticalSection(&StateVariablesCS);

				if (im483i.pfSaveFile != NULL)
				{
					fclose(im483i.pfSaveFile); 
					im483i.pfSaveFile = NULL;
				}
				if ((im483i.bSaveRawData)&&(im483i.pfSaveFile == NULL)) 
				{
					if (strlen(im483i.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", im483i.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "im483i");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					im483i.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (im483i.pfSaveFile == NULL) 
					{
						printf("Unable to create IM483I data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case SAILBOAT_ROBID: // For VSim compatibility...
			case SAILBOAT2_ROBID: // For VSim compatibility...
			case VAIMOS_ROBID:
				if ((GetTimeElapsedChronoQuick(&chrono_sail_calibration) > sail_calibration_period)||
					((bCalibrateSail)&&(!bSailCalibrated))||
					(bForceSailCalibration))
				{
					if ((bCalibrateSail)&&(!bSailCalibrated))
					{
						if (bCheckRudder) mSleep(7000); // Wait for the rudder check...
					}
					bSailCalibrated = FALSE;
					if (CalibrateMotorIM483I(&im483i) != EXIT_SUCCESS)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					bSailCalibrated = TRUE;
					bForceSailCalibration = FALSE;
					StopChronoQuick(&chrono_sail_calibration);
					StartChrono(&chrono_sail_calibration);
				}
				EnterCriticalSection(&StateVariablesCS);
				//angle = deltasmax;
				if (u_f > 0) angle = u_f*(im483i.MaxAngle-im483i.MinAngle)+im483i.MinAngle; else angle = im483i.MinAngle;
				LeaveCriticalSection(&StateVariablesCS);
				//if ((!im483i.bNoContinuousUpdateMaxAngle)||(bUpdateMaxAngleIM483I)) { ... bUpdateMaxAngleIM483I = FALSE; }
				i = 0;
				while (SetMaxAngleIM483I(&im483i, angle) != EXIT_SUCCESS)
				{
					if (i > 4)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					mSleep(im483i.timeout);
					i++;
				}
				break;
			default:
				break;
			}
		}

		//printf("IM483IThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_sail_calibration);

	if (im483i.pfSaveFile != NULL)
	{
		fclose(im483i.pfSaveFile); 
		im483i.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectIM483I(&im483i);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}